

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinParseYaml
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  size_t i;
  NodeData *pNVar1;
  long lVar2;
  allocator_type *in_RCX;
  string *s;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *s_00;
  ulong uVar3;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  allocator<char> local_579;
  json j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_540;
  string local_528 [32];
  string local_508 [32];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_4e8;
  string value;
  Tree doc;
  Tree tree;
  Tree local_2b8;
  bool filled;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filled,"parseYaml",(allocator<char> *)&doc);
  tree.m_buf._0_4_ = 0x13;
  __l._M_len = 1;
  __l._M_array = (iterator)&tree;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_540,__l,in_RCX);
  validateBuiltinArgs(this,loc,(string *)&filled,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)&local_540);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_540);
  std::__cxx11::string::~string((string *)&filled);
  encode_utf8(&value,(UString *)
                     ((((args->
                        super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
                        )._M_impl.super__Vector_impl_data._M_start)->v).h + 1));
  treeFromString(&tree,(Interpreter *)&value,s);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&j,(nullptr_t)0x0);
  i = c4::yml::Tree::root_id(&tree);
  pNVar1 = c4::yml::Tree::_p(&tree,i);
  if ((~(int)(pNVar1->m_type).type & 0x28U) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&filled);
    c4::yml::operator<<((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &filled,&tree);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string<std::allocator<char>>(local_528,"---\n",&local_579);
    doc.m_buf = (NodeData *)&doc.m_size;
    doc.m_cap = 0;
    doc.m_size._0_1_ = 0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while( true ) {
      lVar2 = std::__cxx11::string::find(local_508,(ulong)local_528);
      if (lVar2 == -1) break;
      std::__cxx11::string::substr((ulong)&local_2b8,(ulong)local_508);
      std::__cxx11::string::operator=((string *)&doc,(string *)&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&v,(value_type *)&doc);
    }
    std::__cxx11::string::substr((ulong)&local_2b8,(ulong)local_508);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&v,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&doc);
    std::__cxx11::string::~string(local_528);
    std::__cxx11::string::~string(local_508);
    c4::yml::Tree::Tree(&doc);
    lVar2 = 0;
    s_00 = extraout_RDX;
    for (uVar3 = 0;
        uVar3 < (ulong)((long)v.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)v.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
      if (*(long *)((long)&(v.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_string_length + lVar2) !=
          0) {
        treeFromString(&local_2b8,
                       (Interpreter *)
                       ((long)&((v.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar2),s_00);
        c4::yml::Tree::operator=(&doc,&local_2b8);
        c4::yml::Tree::~Tree(&local_2b8);
        (anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_
                  ((Interpreter *)&local_2b8,&doc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::push_back(&j,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)&local_2b8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&local_2b8);
        s_00 = extraout_RDX_00;
      }
      lVar2 = lVar2 + 0x20;
    }
    c4::yml::Tree::~Tree(&doc);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&v);
    std::__cxx11::stringstream::~stringstream((stringstream *)&filled);
  }
  else {
    (anonymous_namespace)::Interpreter::yamlTreeToJson_abi_cxx11_((Interpreter *)&local_4e8,&tree);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(&j,&local_4e8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_4e8);
  }
  otherJsonToHeap(this,&j,&filled,&this->scratch);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&j);
  c4::yml::Tree::~Tree(&tree);
  std::__cxx11::string::~string((string *)&value);
  return (AST *)0x0;
}

Assistant:

const AST *builtinParseYaml(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "parseYaml", args, {Value::STRING});

        std::string value = encode_utf8(static_cast<HeapString *>(args[0].v.h)->value);

        ryml::Tree tree = treeFromString(value);

        json j;
        if (tree.is_stream(tree.root_id())) {
            // Split into individual yaml documents
            std::stringstream ss;
            ss << tree;
            std::vector<std::string> v = split(ss.str(), "---\n");

            // Convert yaml to json and push onto json array
            ryml::Tree doc;
            for (std::size_t i = 0; i < v.size(); ++i) {
                if (!v[i].empty()) {
                    doc = treeFromString(v[i]);
                    j.push_back(yamlTreeToJson(doc));
                }
            }
        } else {
            j = yamlTreeToJson(tree);
        }

        bool filled;

        otherJsonToHeap(j, filled, scratch);

        return nullptr;
    }